

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CovergroupBodySymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CovergroupBodySymbol,slang::ast::Compilation&,slang::SourceLocation>
          (BumpAllocator *this,Compilation *args,SourceLocation *args_1)

{
  CovergroupBodySymbol *this_00;
  
  this_00 = (CovergroupBodySymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CovergroupBodySymbol *)this->endPtr < this_00 + 1) {
    this_00 = (CovergroupBodySymbol *)allocateSlow(this,0x90,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  ast::CovergroupBodySymbol::CovergroupBodySymbol(this_00,args,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }